

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThreads.cpp
# Opt level: O0

void __thiscall
xmrig::OclThreads::OclThreads
          (OclThreads *this,vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *devices)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator threads;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *in_RDI;
  OclDevice *device;
  const_iterator __end1;
  const_iterator __begin1;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *__range1;
  __normal_iterator<const_xmrig::OclDevice_*,_std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>_>
  *in_stack_ffffffffffffffc0;
  
  std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>::vector
            ((vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_> *)0x214fac);
  this_00 = std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::begin(in_RDI);
  threads = std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_xmrig::OclDevice_*,_std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_xmrig::OclDevice_*,_std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>_>
    ::operator*((__normal_iterator<const_xmrig::OclDevice_*,_std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>_>
                 *)&stack0xffffffffffffffe0);
    OclDevice::generate(this_00._M_current,(OclThreads *)threads._M_current);
    __gnu_cxx::
    __normal_iterator<const_xmrig::OclDevice_*,_std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>_>
    ::operator++((__normal_iterator<const_xmrig::OclDevice_*,_std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

xmrig::OclThreads::OclThreads(const std::vector<OclDevice> &devices)
{
    for (const auto &device : devices) {
        device.generate(*this);
    }
}